

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.cpp
# Opt level: O1

int main(void)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  string *no_path;
  pointer keylen;
  size_type __dnew_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  json_uri http;
  json_uri empty;
  string local_5d0;
  undefined1 local_5b0 [64];
  string local_570 [32];
  string local_550 [32];
  pointer local_530;
  pointer pbStack_528;
  pointer local_520;
  string local_518 [32];
  long *local_4f8;
  long local_4f0;
  long local_4e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  undefined1 local_4c0 [64];
  string local_480 [32];
  string local_460 [32];
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  string sStack_428;
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  json_uri local_3c8;
  json_uri local_310;
  json_uri local_258;
  json_uri local_1a0;
  json_uri local_e8;
  
  pcVar3 = local_4c0 + 0x10;
  local_4c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"");
  nlohmann::json_uri::json_uri(&local_e8,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar3) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  nlohmann::json_uri::json_uri(&local_1a0,&local_e8);
  local_4c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"");
  pcVar1 = local_5b0 + 0x10;
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"");
  paVar2 = &local_3c8.urn_.field_2;
  local_3c8.urn_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"");
  paths(&local_1a0,(string *)local_4c0,(string *)local_5b0,&local_3c8.urn_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.urn_._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8.urn_._M_dataplus._M_p,local_3c8.urn_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  if ((pointer)local_4c0._0_8_ != pcVar3) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  nlohmann::json_uri::~json_uri(&local_1a0);
  local_4c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"http://json-schema.org/draft-07/schema#","");
  nlohmann::json_uri::json_uri(&local_3c8,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar3) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  nlohmann::json_uri::json_uri(&local_258,&local_3c8);
  local_4c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"http://json-schema.org/draft-07/schema","");
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b0,"http://json-schema.org/draft-07","");
  paVar2 = &local_5d0.field_2;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"http://json-schema.org","");
  no_path = &local_5d0;
  paths(&local_258,(string *)local_4c0,(string *)local_5b0,no_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  if ((pointer)local_4c0._0_8_ != pcVar3) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  nlohmann::json_uri::~json_uri(&local_258);
  nlohmann::json_uri::json_uri(&local_310,&local_3c8);
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,"http://json-schema.org/draft-07/schema","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,"http://json-schema.org/draft-07","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"http://json-schema.org","");
  local_5b0[0x10] = '#';
  local_5b0._17_6_ = 0x2f6e6f736a2f;
  local_5b0._23_4_ = 0x68746170;
  local_5b0._8_8_ = 0xb;
  local_5b0[0x1b] = '\0';
  local_5b0._0_8_ = pcVar1;
  nlohmann::json_uri::derive
            ((json_uri *)local_4c0,(EVP_PKEY_CTX *)&local_310,local_5b0,(size_t *)no_path);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append(local_5b0);
  EXPECT_EQ((json_uri *)local_4c0,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x12;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  local_5d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)&local_4d8);
  local_5d0.field_2._M_allocated_capacity =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  builtin_strncpy(local_5d0._M_dataplus._M_p,"#/json/special_%22",0x12);
  local_5d0._M_string_length =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5d0._M_dataplus._M_p
  [(long)local_4d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  nlohmann::json_uri::derive
            ((json_uri *)local_5b0,(EVP_PKEY_CTX *)&local_310,(uchar *)&local_5d0,
             (size_t *)
             local_4d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)local_4c0,(string *)local_5b0);
  std::__cxx11::string::operator=((string *)(local_4c0 + 0x20),(string *)(local_5b0 + 0x20));
  std::__cxx11::string::operator=(local_480,local_570);
  std::__cxx11::string::operator=(local_460,local_550);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  keylen = local_520;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_530;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_528;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_520;
  local_530 = (pointer)0x0;
  pbStack_528 = (pointer)0x0;
  local_520 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::string::operator=((string *)&sStack_428,local_518);
  nlohmann::json_uri::~json_uri((json_uri *)local_5b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append(local_5b0);
  EXPECT_EQ((json_uri *)local_4c0,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_5d0._M_string_length = 4;
  local_5d0.field_2._M_allocated_capacity._0_5_ = 0x6f6f6623;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  nlohmann::json_uri::derive
            ((json_uri *)local_5b0,(EVP_PKEY_CTX *)local_4c0,(uchar *)&local_5d0,(size_t *)keylen);
  std::__cxx11::string::operator=((string *)local_4c0,(string *)local_5b0);
  std::__cxx11::string::operator=((string *)(local_4c0 + 0x20),(string *)(local_5b0 + 0x20));
  std::__cxx11::string::operator=(local_480,local_570);
  std::__cxx11::string::operator=(local_460,local_550);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_530;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_528;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_520;
  local_530 = (pointer)0x0;
  pbStack_528 = (pointer)0x0;
  local_520 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::string::operator=((string *)&sStack_428,local_518);
  nlohmann::json_uri::~json_uri((json_uri *)local_5b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append(local_5b0);
  EXPECT_EQ((json_uri *)local_4c0,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x24;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  local_5d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)&local_4d8);
  local_5d0.field_2._M_allocated_capacity =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  builtin_strncpy(local_5d0._M_dataplus._M_p,"#foo/looks_like_json/poiner/but/isnt",0x24);
  local_5d0._M_string_length =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5d0._M_dataplus._M_p
  [(long)local_4d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  nlohmann::json_uri::derive
            ((json_uri *)local_5b0,(EVP_PKEY_CTX *)local_4c0,(uchar *)&local_5d0,
             (size_t *)
             local_4d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)local_4c0,(string *)local_5b0);
  std::__cxx11::string::operator=((string *)(local_4c0 + 0x20),(string *)(local_5b0 + 0x20));
  std::__cxx11::string::operator=(local_480,local_570);
  std::__cxx11::string::operator=(local_460,local_550);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_530;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_528;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_520;
  local_530 = (pointer)0x0;
  pbStack_528 = (pointer)0x0;
  local_520 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::string::operator=((string *)&sStack_428,local_518);
  nlohmann::json_uri::~json_uri((json_uri *)local_5b0);
  paVar2 = &local_5d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append(local_5b0);
  EXPECT_EQ((json_uri *)local_4c0,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_5d0._M_dataplus._M_p = (pointer)0x23;
  local_5b0._0_8_ = pcVar1;
  local_5b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_5b0,(ulong)&local_5d0);
  local_5b0[0x10] = SUB81(local_5d0._M_dataplus._M_p,0);
  local_5b0._17_6_ = (undefined6)((ulong)local_5d0._M_dataplus._M_p >> 8);
  local_5b0[0x17] = (undefined1)((ulong)local_5d0._M_dataplus._M_p >> 0x38);
  builtin_strncpy((char *)local_5b0._0_8_,"foo/looks_like_json/poiner/but/isnt",0x23);
  local_5b0._8_8_ = local_5d0._M_dataplus._M_p;
  *(char *)(local_5b0._0_8_ + (long)local_5d0._M_dataplus._M_p) = '\0';
  EXPECT_EQ(&sStack_428,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string((string_t *)local_5b0,&local_440);
  local_5d0._M_string_length = 0;
  local_5d0.field_2._M_allocated_capacity =
       local_5d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  EXPECT_EQ((string *)local_5b0,&local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x22;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  local_5d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)&local_4d8);
  local_5d0.field_2._M_allocated_capacity =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  builtin_strncpy(local_5d0._M_dataplus._M_p,"#/looks_like_json/poiner/and/it/is",0x22);
  local_5d0._M_string_length =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5d0._M_dataplus._M_p
  [(long)local_4d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  nlohmann::json_uri::derive
            ((json_uri *)local_5b0,(EVP_PKEY_CTX *)local_4c0,(uchar *)&local_5d0,
             (size_t *)
             local_4d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)local_4c0,(string *)local_5b0);
  std::__cxx11::string::operator=((string *)(local_4c0 + 0x20),(string *)(local_5b0 + 0x20));
  std::__cxx11::string::operator=(local_480,local_570);
  std::__cxx11::string::operator=(local_460,local_550);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_440.reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_530;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_528;
  local_440.reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_520;
  local_530 = (pointer)0x0;
  pbStack_528 = (pointer)0x0;
  local_520 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::string::operator=((string *)&sStack_428,local_518);
  nlohmann::json_uri::~json_uri((json_uri *)local_5b0);
  paVar2 = &local_5d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append(local_5b0);
  EXPECT_EQ((json_uri *)local_4c0,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string((string_t *)local_5b0,&local_440);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x21;
  local_5d0._M_dataplus._M_p = (pointer)paVar2;
  local_5d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)&local_4d8);
  local_5d0.field_2._M_allocated_capacity =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  builtin_strncpy(local_5d0._M_dataplus._M_p,"/looks_like_json/poiner/and/it/is",0x21);
  local_5d0._M_string_length =
       (size_type)
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5d0._M_dataplus._M_p
  [(long)local_4d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  EXPECT_EQ((string *)local_5b0,&local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  local_5b0._8_8_ = 0;
  local_5b0[0x10] = '\0';
  local_5b0._0_8_ = pcVar1;
  EXPECT_EQ(&sStack_428,(string *)local_5b0);
  if ((char *)local_5b0._0_8_ != pcVar1) {
    operator_delete((void *)local_5b0._0_8_,
                    CONCAT17(local_5b0[0x17],CONCAT61(local_5b0._17_6_,local_5b0[0x10])) + 1);
  }
  nlohmann::json_uri::~json_uri((json_uri *)local_4c0);
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  nlohmann::json_uri::~json_uri(&local_310);
  iVar4 = errors;
  nlohmann::json_uri::~json_uri(&local_3c8);
  nlohmann::json_uri::~json_uri(&local_e8);
  return iVar4;
}

Assistant:

int main(void)
{
	json_uri empty("");
	paths(empty,
	      "",
	      "",
	      "");

	json_uri http("http://json-schema.org/draft-07/schema#");
	paths(http,
	      "http://json-schema.org/draft-07/schema",
	      "http://json-schema.org/draft-07",
	      "http://json-schema.org");

	pointer_plain_name(http,
	                   "http://json-schema.org/draft-07/schema",
	                   "http://json-schema.org/draft-07",
	                   "http://json-schema.org");

	return errors;
}